

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O0

void __thiscall
icu_63::Formattable::Formattable(Formattable *this,Formattable *arrayToCopy,int32_t count)

{
  Formattable *pFVar1;
  int32_t count_local;
  Formattable *arrayToCopy_local;
  Formattable *this_local;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)0x0;
  pFVar1 = arrayToCopy;
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Formattable_004de5e8;
  this->fType = kArray;
  UnicodeString::UnicodeString(&this->fBogus);
  init(this,(EVP_PKEY_CTX *)pFVar1);
  this->fType = kArray;
  pFVar1 = createArrayCopy(arrayToCopy,count);
  (this->fValue).fArrayAndCount.fArray = pFVar1;
  (this->fValue).fArrayAndCount.fCount = count;
  return;
}

Assistant:

Formattable::Formattable(const Formattable* arrayToCopy, int32_t count)
    :   UObject(), fType(kArray)
{
    init();
    fType = kArray;
    fValue.fArrayAndCount.fArray = createArrayCopy(arrayToCopy, count);
    fValue.fArrayAndCount.fCount = count;
}